

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
toml::ok<std::__cxx11::string&>
          (success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,toml *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_30 == &local_20) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1f,local_20);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_18;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_30;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_1f,local_20);
  }
  (__return_storage_ptr__->value)._M_string_length = local_28;
  local_28 = 0;
  local_20 = '\0';
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}